

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_compress.c
# Opt level: O2

size_t FSE_compress_wksp(void *dst,size_t dstSize,void *src,size_t srcSize,uint maxSymbolValue,
                        uint tableLog,void *workSpace,size_t wkspSize)

{
  void *dst_00;
  uint maxSymbolValue_00;
  int iVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  int iVar5;
  ulong uVar6;
  uint maxSymbolValue_local;
  void *local_650;
  ulong local_648;
  uint *local_640;
  S16 norm [256];
  U32 count [256];
  
  iVar1 = 1 << ((char)tableLog - 1U & 0x1f);
  iVar5 = 0x400;
  if (0xc < tableLog) {
    iVar5 = 1 << ((char)tableLog - 2U & 0x1f);
  }
  if (wkspSize < iVar1 + maxSymbolValue * 2 + iVar5 + 3) {
    return 0xfffffffffffffffb;
  }
  if (1 < srcSize) {
    local_648 = (ulong)(iVar1 + maxSymbolValue * 2 + 3);
    local_640 = (uint *)((long)workSpace + local_648 * 4);
    maxSymbolValue_local = maxSymbolValue;
    if (maxSymbolValue == 0) {
      maxSymbolValue_local = 0xff;
    }
    uVar2 = 0xb;
    if (tableLog != 0) {
      uVar2 = tableLog;
    }
    local_650 = dst;
    sVar3 = HIST_count_wksp(count,&maxSymbolValue_local,src,srcSize,local_640);
    maxSymbolValue_00 = maxSymbolValue_local;
    if (0xfffffffffffffff7 < sVar3) {
      return sVar3;
    }
    if (sVar3 == srcSize) {
      return 1;
    }
    if (srcSize >> 7 <= sVar3 && sVar3 != 1) {
      uVar2 = FSE_optimalTableLog(uVar2,srcSize,maxSymbolValue_local);
      sVar3 = FSE_normalizeCount(norm,uVar2,count,srcSize,maxSymbolValue_00);
      if (0xfffffffffffffff7 < sVar3) {
        return sVar3;
      }
      sVar3 = FSE_writeNCount(local_650,dstSize,norm,maxSymbolValue_local,uVar2);
      if (0xfffffffffffffff7 < sVar3) {
        return sVar3;
      }
      sVar4 = FSE_buildCTable_wksp
                        ((FSE_CTable *)workSpace,norm,maxSymbolValue_local,uVar2,local_640,
                         wkspSize + local_648 * -4);
      if (0xfffffffffffffff7 < sVar4) {
        return sVar4;
      }
      dst_00 = (void *)((long)local_650 + sVar3);
      sVar3 = FSE_compress_usingCTable(dst_00,dstSize - sVar3,src,srcSize,(FSE_CTable *)workSpace);
      if (0xfffffffffffffff7 < sVar3) {
        return sVar3;
      }
      if (sVar3 != 0) {
        uVar6 = (long)dst_00 + (sVar3 - (long)local_650);
        if (srcSize - 1 <= uVar6) {
          return 0;
        }
        return uVar6;
      }
    }
  }
  return 0;
}

Assistant:

size_t FSE_compress_wksp (void* dst, size_t dstSize, const void* src, size_t srcSize, unsigned maxSymbolValue, unsigned tableLog, void* workSpace, size_t wkspSize)
{
    BYTE* const ostart = (BYTE*) dst;
    BYTE* op = ostart;
    BYTE* const oend = ostart + dstSize;

    U32   count[FSE_MAX_SYMBOL_VALUE+1];
    S16   norm[FSE_MAX_SYMBOL_VALUE+1];
    FSE_CTable* CTable = (FSE_CTable*)workSpace;
    size_t const CTableSize = FSE_CTABLE_SIZE_U32(tableLog, maxSymbolValue);
    void* scratchBuffer = (void*)(CTable + CTableSize);
    size_t const scratchBufferSize = wkspSize - (CTableSize * sizeof(FSE_CTable));

    /* init conditions */
    if (wkspSize < FSE_WKSP_SIZE_U32(tableLog, maxSymbolValue)) return ERROR(tableLog_tooLarge);
    if (srcSize <= 1) return 0;  /* Not compressible */
    if (!maxSymbolValue) maxSymbolValue = FSE_MAX_SYMBOL_VALUE;
    if (!tableLog) tableLog = FSE_DEFAULT_TABLELOG;

    /* Scan input and build symbol stats */
    {   CHECK_V_F(maxCount, HIST_count_wksp(count, &maxSymbolValue, src, srcSize, (unsigned*)scratchBuffer) );
        if (maxCount == srcSize) return 1;   /* only a single symbol in src : rle */
        if (maxCount == 1) return 0;         /* each symbol present maximum once => not compressible */
        if (maxCount < (srcSize >> 7)) return 0;   /* Heuristic : not compressible enough */
    }

    tableLog = FSE_optimalTableLog(tableLog, srcSize, maxSymbolValue);
    CHECK_F( FSE_normalizeCount(norm, tableLog, count, srcSize, maxSymbolValue) );

    /* Write table description header */
    {   CHECK_V_F(nc_err, FSE_writeNCount(op, oend-op, norm, maxSymbolValue, tableLog) );
        op += nc_err;
    }

    /* Compress */
    CHECK_F( FSE_buildCTable_wksp(CTable, norm, maxSymbolValue, tableLog, scratchBuffer, scratchBufferSize) );
    {   CHECK_V_F(cSize, FSE_compress_usingCTable(op, oend - op, src, srcSize, CTable) );
        if (cSize == 0) return 0;   /* not enough space for compressed data */
        op += cSize;
    }

    /* check compressibility */
    if ( (size_t)(op-ostart) >= srcSize-1 ) return 0;

    return op-ostart;
}